

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverageFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::CoverageNameOrHierFunc::CoverageNameOrHierFunc
          (CoverageNameOrHierFunc *this,KnownSystemName knownNameId,Type *returnType,
          uint nameOrHierIndex,size_t requiredArgs,
          vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *argTypes)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 *in_RDI;
  undefined8 in_R8;
  SystemSubroutine *unaff_retaddr;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *in_stack_00000008;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *in_stack_00000010;
  
  SystemSubroutine::SystemSubroutine
            (unaff_retaddr,(KnownSystemName)((ulong)in_RDI >> 0x20),(SubroutineKind)in_RDI);
  *in_RDI = &PTR__CoverageNameOrHierFunc_00dc4fc0;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (in_stack_00000010,in_stack_00000008);
  in_RDI[10] = in_RDX;
  *(undefined4 *)(in_RDI + 0xb) = in_ECX;
  in_RDI[0xc] = in_R8;
  return;
}

Assistant:

CoverageNameOrHierFunc(KnownSystemName knownNameId, const Type& returnType,
                           unsigned int nameOrHierIndex, size_t requiredArgs = 0,
                           const std::vector<const Type*>& argTypes = {}) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), argTypes(argTypes),
        returnType(&returnType), nameOrHierIndex(nameOrHierIndex), requiredArgs(requiredArgs) {
        SLANG_ASSERT(requiredArgs <= argTypes.size());
        SLANG_ASSERT(nameOrHierIndex <= argTypes.size());
        SLANG_ASSERT(requiredArgs > nameOrHierIndex);
    }